

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O0

nullres nullcInitCustomAlloc(_func_void_ptr_int *allocFunc,_func_void_void_ptr *deallocFunc)

{
  bool bVar1;
  int iVar2;
  ExecutorX86 *this;
  ExecutorRegVm *this_00;
  _func_void_void_ptr *local_60;
  _func_void_ptr_int *local_58;
  undefined1 local_40 [7];
  bool initx86;
  TraceScope traceScope;
  _func_void_void_ptr *deallocFunc_local;
  _func_void_ptr_int *allocFunc_local;
  
  NULLC::nullcLastError = "";
  if ((NULLC::initialized & 1) == 0) {
    NULLC::traceContext = NULLC::TraceGetContext();
    if ((nullcInitCustomAlloc::token == '\0') &&
       (iVar2 = __cxa_guard_acquire(&nullcInitCustomAlloc::token), iVar2 != 0)) {
      nullcInitCustomAlloc::token = NULLC::TraceGetToken("nullc","nullcInitCustomAlloc");
      __cxa_guard_release(&nullcInitCustomAlloc::token);
    }
    NULLC::TraceScope::TraceScope((TraceScope *)local_40,nullcInitCustomAlloc::token);
    local_58 = allocFunc;
    if (allocFunc == (_func_void_ptr_int *)0x0) {
      local_58 = NULLC::defaultAlloc;
    }
    NULLC::alloc = local_58;
    local_60 = deallocFunc;
    if (deallocFunc == (_func_void_void_ptr *)0x0) {
      local_60 = NULLC::defaultDealloc;
    }
    NULLC::dealloc = local_60;
    NULLC::fileLoad = NULLC::defaultFileLoad;
    NULLC::errorBuf = (*local_58)(0x10000);
    NULLC::outputBuf = (*(code *)NULLC::alloc)(0x2000);
    NULLC::tempOutputBuf = (*(code *)NULLC::alloc)(0x4000);
    BinaryCache::Initialize();
    BinaryCache::AddImportPath("");
    NULLC::linker = NULLC::construct<Linker>();
    NULLC::SetGlobalLimit(0x40000000);
    this = (ExecutorX86 *)(*(code *)NULLC::alloc)(0x1568);
    ExecutorX86::ExecutorX86(this,NULLC::linker);
    NULLC::executorX86 = this;
    bVar1 = ExecutorX86::Initialize(this);
    if (!bVar1) {
      __assert_fail("initx86",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/nullc.cpp"
                    ,0x79,"nullres nullcInitCustomAlloc(void *(*)(int), void (*)(void *))");
    }
    this_00 = (ExecutorRegVm *)(*(code *)NULLC::alloc)(0x2d0);
    ExecutorRegVm::ExecutorRegVm(this_00,NULLC::linker);
    NULLC::executorRegVm = this_00;
    NULLC::argBuf = (*(code *)NULLC::alloc)(0x10000);
    nullcInitTypeinfoModuleLinkerOnly(NULLC::linker);
    NULLC::initialized = 1;
    allocFunc_local._7_1_ = BuildBaseModule((Allocator *)NULLC::allocator,NULLC::optimizationLevel);
    if (allocFunc_local._7_1_) {
      GrowingAllocatorRef<ChunkedStackPool<65532>,_16384U>::Clear
                ((GrowingAllocatorRef<ChunkedStackPool<65532>,_16384U> *)NULLC::allocator);
    }
    else {
      GrowingAllocatorRef<ChunkedStackPool<65532>,_16384U>::Clear
                ((GrowingAllocatorRef<ChunkedStackPool<65532>,_16384U> *)NULLC::allocator);
      NULLC::nullcLastError = "ERROR: Failed to initialize base module";
    }
    NULLC::TraceScope::~TraceScope((TraceScope *)local_40);
  }
  else {
    NULLC::nullcLastError = "ERROR: NULLC is already initialized";
    allocFunc_local._7_1_ = false;
  }
  return allocFunc_local._7_1_;
}

Assistant:

nullres nullcInitCustomAlloc(void* (*allocFunc)(int), void (*deallocFunc)(void*))
{
	using namespace NULLC;

	nullcLastError = "";

	if(initialized)
	{
		nullcLastError = "ERROR: NULLC is already initialized";
		return 0;
	}

	NULLC::traceContext = TraceGetContext();

	TRACE_SCOPE("nullc", "nullcInitCustomAlloc");

	NULLC::alloc = allocFunc ? allocFunc : NULLC::defaultAlloc;
	NULLC::dealloc = deallocFunc ? deallocFunc : NULLC::defaultDealloc;
	NULLC::fileLoad = NULLC::defaultFileLoad;

	errorBuf = (char*)NULLC::alloc(NULLC_ERROR_BUFFER_SIZE);
	outputBuf = (char*)NULLC::alloc(NULLC_OUTPUT_BUFFER_SIZE);
	tempOutputBuf = (char*)NULLC::alloc(NULLC_TEMP_OUTPUT_BUFFER_SIZE);

	BinaryCache::Initialize();
	BinaryCache::AddImportPath("");

#ifndef NULLC_NO_EXECUTOR
	linker = NULLC::construct<Linker>();

	NULLC::SetGlobalLimit(NULLC_DEFAULT_GLOBAL_MEMORY_LIMIT);
#endif

#ifdef NULLC_BUILD_X86_JIT
	executorX86 = new(NULLC::alloc(sizeof(ExecutorX86))) ExecutorX86(linker);
	bool initx86 = executorX86->Initialize();
	assert(initx86);
	(void)initx86;
#endif

#if defined(NULLC_LLVM_SUPPORT) && !defined(NULLC_NO_EXECUTOR)
	executorLLVM = new(NULLC::alloc(sizeof(ExecutorLLVM))) ExecutorLLVM(linker);
#endif

#ifndef NULLC_NO_EXECUTOR
	executorRegVm = new(NULLC::alloc(sizeof(ExecutorRegVm))) ExecutorRegVm(linker);
#endif

	argBuf = (char*)NULLC::alloc(64 * 1024);

#ifndef NULLC_NO_EXECUTOR
	nullcInitTypeinfoModuleLinkerOnly(linker);
#endif

	initialized = true;

	if(!BuildBaseModule(&allocator, NULLC::optimizationLevel))
	{
		allocator.Clear();

		nullcLastError = "ERROR: Failed to initialize base module";
		return 0;
	}

	allocator.Clear();

	return 1;
}